

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBucket::ScanNewImplicitRoots(LargeHeapBucket *this,Recycler *recycler)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  LargeHeapBlock *heapBlock;
  LargeHeapBlock *pLVar4;
  undefined8 *in_FS_OFFSET;
  
  for (pLVar4 = this->largeBlockList; pLVar4 != (LargeHeapBlock *)0x0; pLVar4 = pLVar4->next) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  for (pLVar4 = this->largePageHeapBlockList; pLVar4 != (LargeHeapBlock *)0x0; pLVar4 = pLVar4->next
      ) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  for (pLVar4 = this->fullLargeBlockList; pLVar4 != (LargeHeapBlock *)0x0; pLVar4 = pLVar4->next) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  for (pLVar4 = this->pendingDisposeLargeBlockList; pLVar4 != (LargeHeapBlock *)0x0;
      pLVar4 = pLVar4->next) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  if (this->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x240,"(pendingSweepLargeBlockList == nullptr)",
                       "pendingSweepLargeBlockList == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
LargeHeapBucket::ScanNewImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(largeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#ifdef RECYCLER_PAGE_HEAP
    HeapBlockList::ForEach(largePageHeapBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif
    HeapBlockList::ForEach(fullLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#if ENABLE_CONCURRENT_GC
    Assert(pendingSweepLargeBlockList == nullptr);
#endif
}